

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesMemoryGetBandwidth(zes_mem_handle_t hMemory,zes_mem_bandwidth_t *pBandwidth)

{
  zes_pfnMemoryGetBandwidth_t pfnGetBandwidth;
  ze_result_t result;
  zes_mem_bandwidth_t *pBandwidth_local;
  zes_mem_handle_t hMemory_local;
  
  pfnGetBandwidth._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd08 != (code *)0x0) {
    pfnGetBandwidth._4_4_ = (*DAT_0011cd08)(hMemory,pBandwidth);
  }
  return pfnGetBandwidth._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesMemoryGetBandwidth(
        zes_mem_handle_t hMemory,                       ///< [in] Handle for the component.
        zes_mem_bandwidth_t* pBandwidth                 ///< [in,out] Will contain the total number of bytes read from and written
                                                        ///< to memory, as well as the current maximum bandwidth.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetBandwidth = context.zesDdiTable.Memory.pfnGetBandwidth;
        if( nullptr != pfnGetBandwidth )
        {
            result = pfnGetBandwidth( hMemory, pBandwidth );
        }
        else
        {
            // generic implementation
        }

        return result;
    }